

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptFunction.cpp
# Opt level: O2

void __thiscall
Js::JavascriptFunction::JavascriptFunction
          (JavascriptFunction *this,DynamicType *type,FunctionInfo *functionInfo,
          ConstructorCache *cache)

{
  code *pcVar1;
  bool bVar2;
  PrototypeChainCache<Js::OnlyWritablePropertyCache> *in_RAX;
  undefined4 *puVar3;
  DynamicTypeHandler *pDVar4;
  WriteBarrierPtr<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_> local_28;
  
  local_28.ptr = in_RAX;
  DynamicObject::DynamicObject(&this->super_DynamicObject,type,true);
  (this->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
  super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject = (_func_int **)&PTR_Finalize_01397e88;
  Memory::WriteBarrierPtr<Js::ConstructorCache>::WriteBarrierSet(&this->constructorCache,cache);
  Memory::WriteBarrierPtr<Js::FunctionInfo>::WriteBarrierSet(&this->functionInfo,functionInfo);
  if ((this->constructorCache).ptr == (ConstructorCache *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptFunction.cpp"
                                ,0x39,"(this->constructorCache != nullptr)",
                                "this->constructorCache != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  pDVar4 = DynamicObject::GetTypeHandler(&this->super_DynamicObject);
  DynamicTypeHandler::ClearHasOnlyWritableDataProperties(pDVar4);
  pDVar4 = DynamicObject::GetTypeHandler(&this->super_DynamicObject);
  if ((pDVar4->flags & 0x20) != 0) {
    Memory::WriteBarrierPtr<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_>::
    WriteBarrierSet(&local_28,
                    &((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->
                      javascriptLibrary).ptr)->typesWithOnlyWritablePropertyProtoChain);
    PrototypeChainCache<Js::OnlyWritablePropertyCache>::Clear(local_28.ptr);
  }
  return;
}

Assistant:

JavascriptFunction::JavascriptFunction(DynamicType * type, FunctionInfo * functionInfo, ConstructorCache* cache)
        : DynamicObject(type), functionInfo(functionInfo), constructorCache(cache)
    {
        Assert(this->constructorCache != nullptr);
        this->GetTypeHandler()->ClearHasOnlyWritableDataProperties(); // length is non-writable
        if (GetTypeHandler()->GetFlags() & DynamicTypeHandler::IsPrototypeFlag)
        {
            // No need to invalidate store field caches for non-writable properties here. Since this type is just being created, it cannot represent
            // an object that is already a prototype. If it becomes a prototype and then we attempt to add a property to an object derived from this
            // object, then we will check if this property is writable, and only if it is will we do the fast path for add property.
            // GetScriptContext()->InvalidateStoreFieldCaches(PropertyIds::length);
            GetLibrary()->GetTypesWithOnlyWritablePropertyProtoChainCache()->Clear();
        }
    }